

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Statistics * __thiscall
asmjit::JitAllocator::statistics(Statistics *__return_storage_ptr__,JitAllocator *this)

{
  Impl *pIVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  size_t sVar6;
  size_t sVar7;
  JitAllocatorPrivateImpl *impl;
  
  __return_storage_ptr__->_reservedSize = 0;
  __return_storage_ptr__->_overheadSize = 0;
  __return_storage_ptr__->_blockCount = 0;
  __return_storage_ptr__->_usedSize = 0;
  pIVar1 = this->_impl;
  if (pIVar1 != (Impl *)JitAllocatorImpl_none) {
    pthread_mutex_lock((pthread_mutex_t *)(pIVar1 + 1));
    lVar2._0_4_ = pIVar1[5].options;
    lVar2._4_4_ = pIVar1[5].blockSize;
    if (lVar2 == 0) {
      sVar3 = 0;
    }
    else {
      plVar5 = (long *)(*(long *)&pIVar1[4].granularity + 0x30);
      sVar4 = 0;
      sVar6 = 0;
      sVar7 = 0;
      sVar3 = 0;
      do {
        sVar3 = sVar3 + *(uint *)(plVar5 + -3);
        sVar7 = sVar7 + plVar5[-2] * (ulong)*(ushort *)((long)plVar5 + -0x14);
        sVar6 = sVar6 + (ulong)*(ushort *)((long)plVar5 + -0x14) * plVar5[-1];
        sVar4 = sVar4 + *plVar5;
        plVar5 = plVar5 + 7;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      __return_storage_ptr__->_reservedSize = sVar7;
      __return_storage_ptr__->_usedSize = sVar6;
      __return_storage_ptr__->_overheadSize = sVar4;
    }
    __return_storage_ptr__->_blockCount = sVar3;
    pthread_mutex_unlock((pthread_mutex_t *)(pIVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

JitAllocator::Statistics JitAllocator::statistics() const noexcept {
  Statistics statistics;
  statistics.reset();

  if (ASMJIT_LIKELY(_impl != &JitAllocatorImpl_none)) {
    JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
    LockGuard guard(impl->lock);

    size_t poolCount = impl->poolCount;
    for (size_t poolId = 0; poolId < poolCount; poolId++) {
      const JitAllocatorPool& pool = impl->pools[poolId];
      statistics._blockCount   += size_t(pool.blockCount);
      statistics._reservedSize += size_t(pool.totalAreaSize) * pool.granularity;
      statistics._usedSize     += size_t(pool.totalAreaUsed) * pool.granularity;
      statistics._overheadSize += size_t(pool.totalOverheadBytes);
    }
  }

  return statistics;
}